

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

string * __thiscall
t_st_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _func_int *p_Var4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  t_const_value_type tVar8;
  t_type *ptVar9;
  ostream *poVar10;
  undefined4 extraout_var;
  int64_t iVar11;
  t_type *ptVar12;
  _Base_ptr p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 extraout_var_00;
  long *plVar15;
  undefined4 extraout_var_01;
  size_type *psVar16;
  long lVar17;
  t_type *type_00;
  pointer pptVar18;
  char *pcVar19;
  _Rb_tree_header *p_Var20;
  _func_int **pp_Var21;
  bool bVar22;
  undefined1 auVar23 [12];
  ostringstream out;
  string local_240;
  string local_220;
  t_type *local_200;
  string *local_1f8;
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_t local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  t_type *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1f8 = __return_storage_ptr__;
  ptVar9 = t_type::get_true_type(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[5])(ptVar9);
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[10])(ptVar9);
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xb])(ptVar9);
      if (((char)iVar7 == '\0') &&
         (iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])(ptVar9), (char)iVar7 == '\0')) {
        iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0x10])(ptVar9);
        if ((char)iVar7 == '\0') {
          iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])(ptVar9);
          if (((char)iVar7 == '\0') &&
             (iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])(ptVar9), (char)iVar7 == '\0')) {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
            std::operator+(pbVar14,"CANNOT GENERATE CONSTANT FOR TYPE: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_01,iVar7));
            __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])(ptVar9);
          local_200 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
          iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])(ptVar9);
          pcVar19 = "(OrderedCollection new";
          bVar22 = (char)iVar7 != '\0';
          if (bVar22) {
            pcVar19 = "(Set new";
          }
          lVar17 = 0x16;
          if (bVar22) {
            lVar17 = 8;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,lVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 2;
          pptVar18 = (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (pptVar18 !=
              (value->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                                   local_240._M_string_length);
              t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"add: ",5);
              render_const_value_abi_cxx11_(&local_240,this,local_200,*pptVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              pptVar18 = pptVar18 + 1;
            } while (pptVar18 !=
                     (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
          t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                               local_240._M_string_length);
          t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"yourself)",9);
        }
        else {
          local_200 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
          local_1b0 = *(t_type **)&ptVar9[1].annotations_._M_t._M_impl;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"(Dictionary new",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 2;
          p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var20 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var13 != p_Var20) {
            paVar2 = &local_240.field_2;
            do {
              t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                                   local_240._M_string_length);
              t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != paVar2) {
                operator_delete(local_240._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at: ",4);
              render_const_value_abi_cxx11_
                        (&local_240,this,local_200,*(t_const_value **)(p_Var13 + 1));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != paVar2) {
                operator_delete(local_240._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," put: ",6);
              render_const_value_abi_cxx11_
                        (&local_240,this,local_1b0,(t_const_value *)p_Var13[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != paVar2) {
                operator_delete(local_240._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            } while ((_Rb_tree_header *)p_Var13 != p_Var20);
          }
          t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                               local_240._M_string_length);
          t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"yourself)",9);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -2;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
        iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
        lVar17 = *(long *)CONCAT44(extraout_var,iVar7);
        local_1d0 = &local_1c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,lVar17,((long *)CONCAT44(extraout_var,iVar7))[1] + lVar17);
        paVar2 = local_1d0;
        iVar7 = toupper((int)local_1d0->_M_local_buf[0]);
        paVar2->_M_local_buf[0] = (char)iVar7;
        sVar6 = local_1c8;
        paVar2 = &local_240.field_2;
        if (local_1d0 == &local_1c0) {
          local_240.field_2._8_8_ = local_1c0._8_8_;
          local_240._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_240._M_dataplus._M_p = (pointer)local_1d0;
        }
        local_240._M_string_length = local_1c8;
        local_1c8 = 0;
        local_1c0._M_local_buf[0] = '\0';
        local_1d0 = &local_1c0;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_240._M_dataplus._M_p,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," new ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        ptVar12 = (t_type *)(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_200 = (t_type *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if (ptVar12 != local_200) {
          do {
            pp_Var21 = ptVar9[1].super_t_doc._vptr_t_doc;
            if (pp_Var21 == (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p) {
              type_00 = (t_type *)0x0;
            }
            else {
              type_00 = (t_type *)0x0;
              do {
                p_Var4 = *pp_Var21;
                lVar17 = *(long *)((long)&(ptVar12->super_t_doc).doc_.field_2 + 8);
                lVar5 = *(long *)(lVar17 + 0x48);
                local_240._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_240,lVar5,*(long *)(lVar17 + 0x50) + lVar5);
                sVar6 = *(size_t *)(p_Var4 + 0x70);
                if (sVar6 == local_240._M_string_length) {
                  if (sVar6 == 0) {
                    bVar22 = true;
                  }
                  else {
                    iVar7 = bcmp(*(void **)(p_Var4 + 0x68),local_240._M_dataplus._M_p,sVar6);
                    bVar22 = iVar7 == 0;
                  }
                }
                else {
                  bVar22 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_240._M_dataplus._M_p != paVar2) {
                  operator_delete(local_240._M_dataplus._M_p);
                }
                if (bVar22) {
                  type_00 = *(t_type **)(*pp_Var21 + 0x60);
                }
                pp_Var21 = pp_Var21 + 1;
              } while (pp_Var21 != (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p);
            }
            if (type_00 == (t_type *)0x0) {
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
              std::operator+(&local_220,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar7));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_220);
              local_240._M_dataplus._M_p = (pointer)*plVar15;
              psVar16 = (size_type *)(plVar15 + 2);
              if ((size_type *)local_240._M_dataplus._M_p == psVar16) {
                local_240.field_2._M_allocated_capacity = *psVar16;
                local_240.field_2._8_8_ = plVar15[3];
                local_240._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_240.field_2._M_allocated_capacity = *psVar16;
              }
              local_240._M_string_length = plVar15[1];
              *plVar15 = (long)psVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              lVar17 = *(long *)((long)&(ptVar12->super_t_doc).doc_.field_2 + 8);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              lVar5 = *(long *)(lVar17 + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f0,lVar5,*(long *)(lVar17 + 0x50) + lVar5);
              std::operator+(pbVar14,&local_240,&local_1f0);
              __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                                 local_240._M_string_length);
            lVar17 = *(long *)((long)&(ptVar12->super_t_doc).doc_.field_2 + 8);
            lVar5 = *(long *)(lVar17 + 0x48);
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_220,lVar5,*(long *)(lVar17 + 0x50) + lVar5);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
            render_const_value_abi_cxx11_
                      (&local_1f0,this,type_00,*(t_const_value **)&(ptVar12->super_t_doc).has_doc_);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != paVar2) {
              operator_delete(local_240._M_dataplus._M_p);
            }
            ptVar12 = (t_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar12);
          } while (ptVar12 != local_200);
        }
        t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                             local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"yourself)",9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)poVar10);
    }
  }
  else {
    uVar3 = *(uint *)&ptVar9[1].super_t_doc._vptr_t_doc;
    switch(uVar3) {
    case 1:
      local_240._M_dataplus._M_p._0_1_ = 0x22;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)&local_240,1);
      t_generator::get_escaped_string_abi_cxx11_(&local_240,(t_generator *)this,value);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_240._M_dataplus._M_p,local_240._M_string_length);
      local_220._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_220,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      break;
    case 2:
      iVar11 = t_const_value::get_integer(value);
      pcVar19 = "false";
      if (0 < iVar11) {
        pcVar19 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar19,(ulong)(0 < iVar11) ^ 5);
      break;
    case 7:
      tVar8 = t_const_value::get_type(value);
      if (tVar8 != CV_INTEGER) {
        std::ostream::_M_insert<double>(value->doubleVal_);
        break;
      }
    case 3:
    case 4:
    case 5:
    case 6:
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
      break;
    default:
      auVar23 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_240,(t_base_type *)(ulong)uVar3,auVar23._8_4_);
      std::operator+(auVar23._0_8_,"compiler error: no const of base type ",&local_240);
      __cxa_throw(auVar23._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1f8;
}

Assistant:

string t_st_generator::render_const_value(t_type* type, t_const_value* value) {
  type = get_true_type(type);
  std::ostringstream out;
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    indent(out) << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << "(" << capitalize(type->get_name()) << " new " << endl;
    indent_up();

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }

      out << indent() << v_iter->first->get_string() << ": "
          << render_const_value(field_type, v_iter->second) << ";" << endl;
    }
    out << indent() << "yourself)";

    indent_down();
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    out << "(Dictionary new" << endl;
    indent_up();
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent() << indent();
      out << "at: " << render_const_value(ktype, v_iter->first);
      out << " put: ";
      out << render_const_value(vtype, v_iter->second);
      out << ";" << endl;
    }
    out << indent() << indent() << "yourself)";
    indent_down();
    indent_down();
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    if (type->is_set()) {
      out << "(Set new" << endl;
    } else {
      out << "(OrderedCollection new" << endl;
    }
    indent_up();
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent() << indent();
      out << "add: " << render_const_value(etype, *v_iter);
      out << ";" << endl;
    }
    out << indent() << indent() << "yourself)";
    indent_down();
    indent_down();
  } else {
    throw "CANNOT GENERATE CONSTANT FOR TYPE: " + type->get_name();
  }
  return out.str();
}